

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O2

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThanNullsFirst>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  long *plVar5;
  data_ptr_t pdVar6;
  ulong *puVar7;
  data_ptr_t pdVar8;
  uint *puVar9;
  ushort *puVar10;
  int *piVar11;
  byte *pbVar12;
  short *psVar13;
  idx_t i_6;
  SelectionVector *pSVar14;
  ValidityMask *pVVar15;
  ulong uVar16;
  TemplatedValidityMask<unsigned_long> *this;
  Vector *pVVar17;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference pvVar18;
  type pVVar19;
  ulong uVar20;
  idx_t iVar21;
  InternalException *this_02;
  NotImplementedException *this_03;
  bool bVar22;
  ulong uVar23;
  optional_ptr<duckdb::SelectionVector,_true> oVar24;
  idx_t i_11;
  idx_t iVar25;
  interval_t *piVar26;
  double *pdVar27;
  float *pfVar28;
  string_t *psVar29;
  uhugeint_t *puVar30;
  hugeint_t *phVar31;
  idx_t i;
  sel_t sVar32;
  size_type __n;
  UnifiedVectorFormat *pUVar33;
  ulong uVar34;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar35;
  idx_t iVar36;
  idx_t false_count_14;
  ulong uVar37;
  idx_t i_8;
  idx_t false_count_2;
  idx_t iVar38;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  idx_t iVar39;
  long lVar40;
  idx_t i_5;
  ulong uVar41;
  idx_t pos;
  ValidityMask *pVVar42;
  interval_t *piVar43;
  double *pdVar44;
  float *pfVar45;
  string_t *psVar46;
  uhugeint_t *puVar47;
  hugeint_t *phVar48;
  bool bVar49;
  bool bVar50;
  idx_t local_4c0;
  idx_t pos_1;
  UnifiedVectorFormat lvdata;
  idx_t local_420;
  optional_ptr<duckdb::ValidityMask,_true> local_418;
  UnifiedVectorFormat rvdata;
  optional_ptr<duckdb::ValidityMask,_true> local_3a8;
  SelectionVector lcursor;
  SelectionVector rcursor;
  SelectionVector maybe_vec;
  SelectionVector slice_sel;
  SelectionVector true_sel_1;
  SelectionVector true_sel_2;
  SelectionVector false_sel_1;
  Vector lchild;
  OptionalSelection false_opt;
  OptionalSelection true_opt;
  optional_ptr<duckdb::SelectionVector,_true> local_240;
  optional_ptr<const_duckdb::SelectionVector,_true> local_238;
  UnifiedVectorFormat rvdata_1;
  UnifiedVectorFormat lvdata_1;
  optional_ptr<duckdb::SelectionVector,_true> local_1a0;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector rchild;
  Vector l_not_null;
  Vector r_not_null;
  
  PVar1 = (left->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = (char)pdVar8[iVar21] < (char)pdVar6[iVar21];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = (char)pdVar8[iVar21] < (char)pdVar6[iVar21];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = (char)pdVar8[iVar21] < (char)pdVar6[iVar21];
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
LAB_009556e1:
        return count - lVar40;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = (char)pdVar6[iVar21] <= (char)*pdVar8;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
LAB_009560bf:
            local_4c0 = count - lVar40;
          }
          else {
            local_4c0 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if (bVar49 && !bVar50) {
                bVar49 = (char)*pdVar8 < (char)pdVar6[iVar21];
              }
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
            }
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = (char)*pdVar8 < (char)pdVar6[iVar21];
              bVar22 = (char)pdVar6[iVar21] <= (char)*pdVar8;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = (char)pdVar8[iVar21] < (char)*pdVar6;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
LAB_0095613e:
            local_4c0 = count - lVar40;
          }
          else {
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = (char)pdVar8[iVar21] < (char)*pdVar6;
              }
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
            }
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = (char)pdVar8[iVar21] < (char)*pdVar6;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
LAB_0095640c:
        pUVar33 = &lvdata;
        goto LAB_00956411;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_0095247f:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if ((char)*right->data < (char)*left->data) goto LAB_0095247f;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if ((char)rvdata.data[iVar38] < (char)lvdata.data[iVar36]) goto LAB_0094c151;
LAB_0094c13f:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094c13f;
LAB_0094c151:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if ((char)rvdata.data[iVar36] < (char)lvdata.data[iVar39]) {
LAB_0094e4f3:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_0094e4f3;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if ((char)lvdata.data[iVar39] <= (char)rvdata.data[iVar36]) {
LAB_00952448:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_00952448;
      }
LAB_009544a9:
      local_4c0 = count - lVar40;
      goto LAB_00954850;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if ((char)rvdata.data[iVar38] < (char)lvdata.data[iVar36]) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if ((char)rvdata.data[iVar36] < (char)lvdata.data[iVar39]) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if ((char)lvdata.data[iVar39] <= (char)rvdata.data[iVar36]) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case UINT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = pdVar8[iVar21] < pdVar6[iVar21];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = pdVar8[iVar21] < pdVar6[iVar21];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = pdVar8[iVar21] < pdVar6[iVar21];
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_009556e1;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        pbVar12 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = pdVar6[iVar21] <= *pbVar12;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
            goto LAB_009560bf;
          }
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if (bVar49 && !bVar50) {
              bVar49 = *pbVar12 < pdVar6[iVar21];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = *pbVar12 < pdVar6[iVar21];
              bVar22 = pdVar6[iVar21] <= *pbVar12;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pbVar12 = left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = pdVar6[iVar21] < *pbVar12;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
            goto LAB_0095613e;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = pdVar6[iVar21] < *pbVar12;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = pdVar6[iVar21] < *pbVar12;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_00954c71:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if (*right->data < *left->data) goto LAB_00954c71;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (rvdata.data[iVar38] < lvdata.data[iVar36]) goto LAB_0094e3b5;
LAB_0094e3a3:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094e3a3;
LAB_0094e3b5:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (rvdata.data[iVar36] < lvdata.data[iVar39]) {
LAB_00950033:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_00950033;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if (lvdata.data[iVar39] <= rvdata.data[iVar36]) {
LAB_0095413e:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_0095413e;
      }
      goto LAB_009544a9;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (rvdata.data[iVar38] < lvdata.data[iVar36]) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (rvdata.data[iVar36] < lvdata.data[iVar39]) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if (lvdata.data[iVar39] <= rvdata.data[iVar36]) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case UINT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(ushort *)(pdVar8 + iVar21 * 2) < *(ushort *)(pdVar6 + iVar21 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(ushort *)(pdVar8 + iVar21 * 2) < *(ushort *)(pdVar6 + iVar21 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = *(ushort *)(pdVar8 + iVar21 * 2) < *(ushort *)(pdVar6 + iVar21 * 2);
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_009556e1;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        puVar10 = (ushort *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = *(ushort *)(pdVar6 + iVar21 * 2) <= *puVar10;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
            goto LAB_009560bf;
          }
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if (bVar49 && !bVar50) {
              bVar49 = *puVar10 < *(ushort *)(pdVar6 + iVar21 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = *puVar10 < *(ushort *)(pdVar6 + iVar21 * 2);
              bVar22 = *(ushort *)(pdVar6 + iVar21 * 2) <= *puVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar10 = (ushort *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = *(ushort *)(pdVar6 + iVar21 * 2) < *puVar10;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
            goto LAB_0095613e;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(ushort *)(pdVar6 + iVar21 * 2) < *puVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(ushort *)(pdVar6 + iVar21 * 2) < *puVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_00954b21:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(ushort *)right->data < *(ushort *)left->data) goto LAB_00954b21;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(ushort *)(rvdata.data + iVar38 * 2) < *(ushort *)(lvdata.data + iVar36 * 2))
            goto LAB_0094e215;
LAB_0094e203:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094e203;
LAB_0094e215:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(ushort *)(rvdata.data + iVar36 * 2) < *(ushort *)(lvdata.data + iVar39 * 2)) {
LAB_0094fdbf:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_0094fdbf;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if (*(ushort *)(lvdata.data + iVar39 * 2) <= *(ushort *)(rvdata.data + iVar36 * 2)) {
LAB_00953f3c:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_00953f3c;
      }
      goto LAB_009544a9;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(ushort *)(rvdata.data + iVar38 * 2) < *(ushort *)(lvdata.data + iVar36 * 2)) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (*(ushort *)(rvdata.data + iVar36 * 2) < *(ushort *)(lvdata.data + iVar39 * 2)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if (*(ushort *)(lvdata.data + iVar39 * 2) <= *(ushort *)(rvdata.data + iVar36 * 2)) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case INT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(short *)(pdVar8 + iVar21 * 2) < *(short *)(pdVar6 + iVar21 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(short *)(pdVar8 + iVar21 * 2) < *(short *)(pdVar6 + iVar21 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = *(short *)(pdVar8 + iVar21 * 2) < *(short *)(pdVar6 + iVar21 * 2);
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_009556e1;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        psVar13 = (short *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = *(short *)(pdVar6 + iVar21 * 2) <= *psVar13;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
            goto LAB_009560bf;
          }
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if (bVar49 && !bVar50) {
              bVar49 = *psVar13 < *(short *)(pdVar6 + iVar21 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = *psVar13 < *(short *)(pdVar6 + iVar21 * 2);
              bVar22 = *(short *)(pdVar6 + iVar21 * 2) <= *psVar13;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar13 = (short *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = *(short *)(pdVar6 + iVar21 * 2) < *psVar13;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
            goto LAB_0095613e;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(short *)(pdVar6 + iVar21 * 2) < *psVar13;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(short *)(pdVar6 + iVar21 * 2) < *psVar13;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_00954ed8:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(short *)right->data < *(short *)left->data) goto LAB_00954ed8;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(short *)(rvdata.data + iVar38 * 2) < *(short *)(lvdata.data + iVar36 * 2))
            goto LAB_0094e78d;
LAB_0094e77b:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094e77b;
LAB_0094e78d:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(short *)(rvdata.data + iVar36 * 2) < *(short *)(lvdata.data + iVar39 * 2)) {
LAB_0095042d:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_0095042d;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if (*(short *)(lvdata.data + iVar39 * 2) <= *(short *)(rvdata.data + iVar36 * 2)) {
LAB_00954492:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_00954492;
      }
      goto LAB_009544a9;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(short *)(rvdata.data + iVar38 * 2) < *(short *)(lvdata.data + iVar36 * 2)) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (*(short *)(rvdata.data + iVar36 * 2) < *(short *)(lvdata.data + iVar39 * 2)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if (*(short *)(lvdata.data + iVar39 * 2) <= *(short *)(rvdata.data + iVar36 * 2)) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case UINT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(uint *)(pdVar8 + iVar21 * 4) < *(uint *)(pdVar6 + iVar21 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(uint *)(pdVar8 + iVar21 * 4) < *(uint *)(pdVar6 + iVar21 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = *(uint *)(pdVar8 + iVar21 * 4) < *(uint *)(pdVar6 + iVar21 * 4);
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_009556e1;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        puVar9 = (uint *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = *(uint *)(pdVar6 + iVar21 * 4) <= *puVar9;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
            goto LAB_009560bf;
          }
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if (bVar49 && !bVar50) {
              bVar49 = *puVar9 < *(uint *)(pdVar6 + iVar21 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = *puVar9 < *(uint *)(pdVar6 + iVar21 * 4);
              bVar22 = *(uint *)(pdVar6 + iVar21 * 4) <= *puVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar9 = (uint *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = *(uint *)(pdVar6 + iVar21 * 4) < *puVar9;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
            goto LAB_0095613e;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(uint *)(pdVar6 + iVar21 * 4) < *puVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(uint *)(pdVar6 + iVar21 * 4) < *puVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_00954a7a:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(uint *)right->data < *(uint *)left->data) goto LAB_00954a7a;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(uint *)(rvdata.data + iVar38 * 4) < *(uint *)(lvdata.data + iVar36 * 4))
            goto LAB_0094e143;
LAB_0094e131:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094e131;
LAB_0094e143:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(uint *)(rvdata.data + iVar36 * 4) < *(uint *)(lvdata.data + iVar39 * 4)) {
LAB_0094fc81:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_0094fc81;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if (*(uint *)(lvdata.data + iVar39 * 4) <= *(uint *)(rvdata.data + iVar36 * 4)) {
LAB_00953e37:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_00953e37;
      }
      goto LAB_009544a9;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(uint *)(rvdata.data + iVar38 * 4) < *(uint *)(lvdata.data + iVar36 * 4)) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (*(uint *)(rvdata.data + iVar36 * 4) < *(uint *)(lvdata.data + iVar39 * 4)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if (*(uint *)(lvdata.data + iVar39 * 4) <= *(uint *)(rvdata.data + iVar36 * 4)) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case INT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(int *)(pdVar8 + iVar21 * 4) < *(int *)(pdVar6 + iVar21 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(int *)(pdVar8 + iVar21 * 4) < *(int *)(pdVar6 + iVar21 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = *(int *)(pdVar8 + iVar21 * 4) < *(int *)(pdVar6 + iVar21 * 4);
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_009556e1;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        piVar11 = (int *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = *(int *)(pdVar6 + iVar21 * 4) <= *piVar11;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
            goto LAB_009560bf;
          }
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if (bVar49 && !bVar50) {
              bVar49 = *piVar11 < *(int *)(pdVar6 + iVar21 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = *piVar11 < *(int *)(pdVar6 + iVar21 * 4);
              bVar22 = *(int *)(pdVar6 + iVar21 * 4) <= *piVar11;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar11 = (int *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = *(int *)(pdVar6 + iVar21 * 4) < *piVar11;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
            goto LAB_0095613e;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(int *)(pdVar6 + iVar21 * 4) < *piVar11;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(int *)(pdVar6 + iVar21 * 4) < *piVar11;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_00954bca:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(int *)right->data < *(int *)left->data) goto LAB_00954bca;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(int *)(rvdata.data + iVar38 * 4) < *(int *)(lvdata.data + iVar36 * 4))
            goto LAB_0094e2e5;
LAB_0094e2d3:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094e2d3;
LAB_0094e2e5:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(int *)(rvdata.data + iVar36 * 4) < *(int *)(lvdata.data + iVar39 * 4)) {
LAB_0094fef9:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_0094fef9;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if (*(int *)(lvdata.data + iVar39 * 4) <= *(int *)(rvdata.data + iVar36 * 4)) {
LAB_0095403d:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_0095403d;
      }
      goto LAB_009544a9;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(int *)(rvdata.data + iVar38 * 4) < *(int *)(lvdata.data + iVar36 * 4)) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (*(int *)(rvdata.data + iVar36 * 4) < *(int *)(lvdata.data + iVar39 * 4)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if (*(int *)(lvdata.data + iVar39 * 4) <= *(int *)(rvdata.data + iVar36 * 4)) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case UINT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(ulong *)(pdVar8 + iVar21 * 8) < *(ulong *)(pdVar6 + iVar21 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(ulong *)(pdVar8 + iVar21 * 8) < *(ulong *)(pdVar6 + iVar21 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = *(ulong *)(pdVar8 + iVar21 * 8) < *(ulong *)(pdVar6 + iVar21 * 8);
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_009556e1;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        puVar7 = (ulong *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = *(ulong *)(pdVar6 + iVar21 * 8) <= *puVar7;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
            goto LAB_009560bf;
          }
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if (bVar49 && !bVar50) {
              bVar49 = *puVar7 < *(ulong *)(pdVar6 + iVar21 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = *puVar7 < *(ulong *)(pdVar6 + iVar21 * 8);
              bVar22 = *(ulong *)(pdVar6 + iVar21 * 8) <= *puVar7;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar7 = (ulong *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = *(ulong *)(pdVar6 + iVar21 * 8) < *puVar7;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
            goto LAB_0095613e;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(ulong *)(pdVar6 + iVar21 * 8) < *puVar7;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(ulong *)(pdVar6 + iVar21 * 8) < *puVar7;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_009549d1:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(ulong *)right->data < *(ulong *)left->data) goto LAB_009549d1;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(ulong *)(rvdata.data + iVar38 * 8) < *(ulong *)(lvdata.data + iVar36 * 8))
            goto LAB_0094e073;
LAB_0094e061:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094e061;
LAB_0094e073:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(ulong *)(rvdata.data + iVar36 * 8) < *(ulong *)(lvdata.data + iVar39 * 8)) {
LAB_0094fb47:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_0094fb47;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if (*(ulong *)(lvdata.data + iVar39 * 8) <= *(ulong *)(rvdata.data + iVar36 * 8)) {
LAB_00953d36:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_00953d36;
      }
      goto LAB_009544a9;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(ulong *)(rvdata.data + iVar38 * 8) < *(ulong *)(lvdata.data + iVar36 * 8)) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (*(ulong *)(rvdata.data + iVar36 * 8) < *(ulong *)(lvdata.data + iVar39 * 8)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if (*(ulong *)(lvdata.data + iVar39 * 8) <= *(ulong *)(rvdata.data + iVar36 * 8)) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case INT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(long *)(pdVar8 + iVar21 * 8) < *(long *)(pdVar6 + iVar21 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar49) && (bVar50)) {
              bVar49 = *(long *)(pdVar8 + iVar21 * 8) < *(long *)(pdVar6 + iVar21 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          if ((bVar49) && (bVar50)) {
            bVar49 = *(long *)(pdVar8 + iVar21 * 8) < *(long *)(pdVar6 + iVar21 * 8);
          }
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_009556e1;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        plVar5 = (long *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = !bVar49;
              if (!bVar50 && !bVar49) {
                bVar49 = *(long *)(pdVar6 + iVar21 * 8) <= *plVar5;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)bVar49;
            }
            goto LAB_009560bf;
          }
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if (bVar49 && !bVar50) {
              bVar49 = *plVar5 < *(long *)(pdVar6 + iVar21 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar22 = !bVar49;
            if (!bVar50 && !bVar22) {
              bVar49 = *plVar5 < *(long *)(pdVar6 + iVar21 * 8);
              bVar22 = *(long *)(pdVar6 + iVar21 * 8) <= *plVar5;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)bVar22;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar5 = (long *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = true;
              }
              else {
                bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if ((bVar50 & bVar49) == 1) {
                bVar49 = *(long *)(pdVar6 + iVar21 * 8) < *plVar5;
              }
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
            }
            goto LAB_0095613e;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(long *)(pdVar6 + iVar21 * 8) < *plVar5;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = true;
            }
            else {
              bVar49 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if ((bVar50 & bVar49) == 1) {
              bVar49 = *(long *)(pdVar6 + iVar21 * 8) < *plVar5;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)(bVar49 ^ 1);
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar50 | bVar49)) {
          if (!bVar49) {
LAB_00954928:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(long *)right->data < *(long *)left->data) goto LAB_00954928;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar21 = 0;
        local_4c0 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(long *)(rvdata.data + iVar38 * 8) < *(long *)(lvdata.data + iVar36 * 8))
            goto LAB_0094dfa2;
LAB_0094df90:
            iVar36 = iVar21;
            iVar21 = iVar21 + 1;
            oVar24.ptr = false_sel.ptr;
          }
          else {
            if (!bVar49) goto LAB_0094df90;
LAB_0094dfa2:
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar50 = true;
          bVar49 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if ((bool)(bVar50 & bVar49)) {
            if (*(long *)(rvdata.data + iVar36 * 8) < *(long *)(lvdata.data + iVar39 * 8)) {
LAB_0094fa0d:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          else if (bVar49) goto LAB_0094fa0d;
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar50 = true;
        bVar49 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if ((bool)(bVar50 & bVar49)) {
          if (*(long *)(lvdata.data + iVar39 * 8) <= *(long *)(rvdata.data + iVar36 * 8)) {
LAB_00953c34:
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        else if (!bVar49) goto LAB_00953c34;
      }
      goto LAB_009544a9;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(long *)(rvdata.data + iVar38 * 8) < *(long *)(lvdata.data + iVar36 * 8)) {
          iVar36 = iVar21;
          iVar21 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar21 + 1;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar21] = (sel_t)iVar39;
        iVar21 = iVar36;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (*(long *)(rvdata.data + iVar36 * 8) < *(long *)(lvdata.data + iVar39 * 8)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      if (*(long *)(lvdata.data + iVar39 * 8) <= *(long *)(rvdata.data + iVar36 * 8)) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_0094acf5_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&lvdata,"Invalid type for distinct selection",(allocator *)&rvdata);
    InternalException::InternalException(this_02,(string *)&lvdata);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar45 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            pfVar45 = pfVar45 + 1;
            pfVar28 = pfVar28 + 1;
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pfVar45 = pfVar45 + 1;
            pfVar28 = pfVar28 + 1;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar50,!bVar49);
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)!bVar49;
          pfVar45 = pfVar45 + 1;
          pfVar28 = pfVar28 + 1;
        }
LAB_0095584f:
        return count - lVar40;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar45 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,bVar50,!bVar49);
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              pfVar28 = pfVar28 + 1;
            }
            goto LAB_009563ff;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pfVar28 = pfVar28 + 1;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            pfVar28 = pfVar28 + 1;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar45 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar50,bVar49);
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              pfVar45 = pfVar45 + 1;
            }
LAB_009563ff:
            local_4c0 = count - lVar40;
          }
          else {
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar50,bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              pfVar45 = pfVar45 + 1;
            }
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar50,bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            pfVar45 = pfVar45 + 1;
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<float>
                           ((float *)left->data,(float *)right->data,bVar50,bVar49);
        if (!bVar49) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar21 = 0;
        for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
          uVar34 = uVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
          }
          uVar41 = uVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
          }
          uVar23 = uVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<float>
                             ((float *)(lvdata.data + uVar41 * 4),
                              (float *)(rvdata.data + uVar23 * 4),bVar50,bVar49);
          if (bVar49) {
            iVar25 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            iVar39 = iVar21;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar39 = iVar21 + 1;
            iVar25 = iVar21;
            oVar24.ptr = false_sel.ptr;
          }
          (oVar24.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar21 = iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
          uVar34 = uVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
          }
          uVar41 = uVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
          }
          uVar23 = uVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<float>
                             ((float *)(lvdata.data + uVar41 * 4),
                              (float *)(rvdata.data + uVar23 * 4),bVar50,bVar49);
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
        uVar34 = uVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
        }
        uVar41 = uVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
        }
        uVar23 = uVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<float>
                           ((float *)(lvdata.data + uVar41 * 4),(float *)(rvdata.data + uVar23 * 4),
                            bVar50,bVar49);
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)uVar34;
          lVar40 = lVar40 + 1;
        }
      }
LAB_00954843:
      local_4c0 = count - lVar40;
      goto LAB_00954850;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
        uVar34 = uVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
        }
        uVar41 = uVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
        }
        uVar23 = uVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
        }
        bVar49 = GreaterThan::Operation<float>
                           ((float *)(lvdata.data + uVar41 * 4),(float *)(rvdata.data + uVar23 * 4))
        ;
        if (bVar49) {
          iVar25 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          iVar39 = iVar21;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar39 = iVar21 + 1;
          iVar25 = iVar21;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
        iVar21 = iVar39;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
        uVar34 = uVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
        }
        uVar41 = uVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
        }
        uVar23 = uVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
        }
        bVar49 = GreaterThan::Operation<float>
                           ((float *)(lvdata.data + uVar41 * 4),(float *)(rvdata.data + uVar23 * 4))
        ;
        if (bVar49) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
      uVar34 = uVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
      }
      uVar41 = uVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
      }
      uVar23 = uVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
      }
      bVar49 = GreaterThan::Operation<float>
                         ((float *)(lvdata.data + uVar41 * 4),(float *)(rvdata.data + uVar23 * 4));
      if (!bVar49) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)uVar34;
        lVar40 = lVar40 + 1;
      }
    }
    goto LAB_00954779;
  case DOUBLE:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar44 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            pdVar44 = pdVar44 + 1;
            pdVar27 = pdVar27 + 1;
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pdVar44 = pdVar44 + 1;
            pdVar27 = pdVar27 + 1;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar50,!bVar49);
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)!bVar49;
          pdVar44 = pdVar44 + 1;
          pdVar27 = pdVar27 + 1;
        }
        goto LAB_0095584f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar44 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,bVar50,!bVar49);
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              pdVar27 = pdVar27 + 1;
            }
            goto LAB_009563ff;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pdVar27 = pdVar27 + 1;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            pdVar27 = pdVar27 + 1;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar44 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar50,bVar49);
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              pdVar44 = pdVar44 + 1;
            }
            goto LAB_009563ff;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar50,bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pdVar44 = pdVar44 + 1;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar50,bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            pdVar44 = pdVar44 + 1;
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<double>
                           ((double *)left->data,(double *)right->data,bVar50,bVar49);
        if (!bVar49) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar21 = 0;
        for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
          uVar34 = uVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
          }
          uVar41 = uVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
          }
          uVar23 = uVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<double>
                             ((double *)(lvdata.data + uVar41 * 8),
                              (double *)(rvdata.data + uVar23 * 8),bVar50,bVar49);
          if (bVar49) {
            iVar25 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            iVar39 = iVar21;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar39 = iVar21 + 1;
            iVar25 = iVar21;
            oVar24.ptr = false_sel.ptr;
          }
          (oVar24.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar21 = iVar39;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
          uVar34 = uVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
          }
          uVar41 = uVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
          }
          uVar23 = uVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<double>
                             ((double *)(lvdata.data + uVar41 * 8),
                              (double *)(rvdata.data + uVar23 * 8),bVar50,bVar49);
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
        uVar34 = uVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
        }
        uVar41 = uVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
        }
        uVar23 = uVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar41 >> 6] >> (uVar41 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<double>
                           ((double *)(lvdata.data + uVar41 * 8),
                            (double *)(rvdata.data + uVar23 * 8),bVar50,bVar49);
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)uVar34;
          lVar40 = lVar40 + 1;
        }
      }
      goto LAB_00954843;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
        uVar34 = uVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
        }
        uVar41 = uVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
        }
        uVar23 = uVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
        }
        bVar49 = GreaterThan::Operation<double>
                           ((double *)(lvdata.data + uVar41 * 8),
                            (double *)(rvdata.data + uVar23 * 8));
        if (bVar49) {
          iVar25 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          iVar39 = iVar21;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar39 = iVar21 + 1;
          iVar25 = iVar21;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
        iVar21 = iVar39;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
        uVar34 = uVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
        }
        uVar41 = uVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
        }
        uVar23 = uVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
        }
        bVar49 = GreaterThan::Operation<double>
                           ((double *)(lvdata.data + uVar41 * 8),
                            (double *)(rvdata.data + uVar23 * 8));
        if (bVar49) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (uVar20 = 0; count != uVar20; uVar20 = uVar20 + 1) {
      uVar34 = uVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        uVar34 = (ulong)(sel.ptr)->sel_vector[uVar20];
      }
      uVar41 = uVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar41 = (ulong)(lvdata.sel)->sel_vector[uVar20];
      }
      uVar23 = uVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar23 = (ulong)(rvdata.sel)->sel_vector[uVar20];
      }
      bVar49 = GreaterThan::Operation<double>
                         ((double *)(lvdata.data + uVar41 * 8),(double *)(rvdata.data + uVar23 * 8))
      ;
      if (!bVar49) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)uVar34;
        lVar40 = lVar40 + 1;
      }
    }
    goto LAB_00954779;
  case INTERVAL:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar43 = (interval_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar42 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar40 = 0;
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            piVar43 = piVar43 + 1;
            piVar26 = piVar26 + 1;
          }
          return local_4c0;
        }
        iVar21 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            piVar43 = piVar43 + 1;
            piVar26 = piVar26 + 1;
          }
          return local_4c0;
        }
        lVar40 = 0;
        for (; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
          bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                             (piVar26,piVar43,!bVar50,!bVar49);
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + (ulong)!bVar49;
          piVar43 = piVar43 + 1;
          piVar26 = piVar26 + 1;
        }
        goto LAB_0095584f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar43 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                                 (piVar26,piVar43,bVar50,!bVar49);
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              piVar26 = piVar26 + 1;
            }
            goto LAB_009563ff;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            piVar26 = piVar26 + 1;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,bVar50,!bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            piVar26 = piVar26 + 1;
          }
        }
        goto LAB_0095640c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar43 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        iVar21 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar40 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                                 (piVar26,piVar43,!bVar50,bVar49);
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              piVar43 = piVar43 + 1;
            }
            goto LAB_009563ff;
          }
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar50,bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            piVar43 = piVar43 + 1;
          }
        }
        else {
          lVar40 = 0;
          local_4c0 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar50,bVar49);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            piVar43 = piVar43 + 1;
          }
        }
        goto LAB_0095640c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                           ((interval_t *)left->data,(interval_t *)right->data,bVar50,bVar49);
        if (!bVar49) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar21 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar36 * 0x10),
                              (interval_t *)(rvdata.data + iVar38 * 0x10),bVar50,bVar49);
          if (bVar49) {
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            iVar38 = iVar21;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar38 = iVar21 + 1;
            iVar36 = iVar21;
            oVar24.ptr = false_sel.ptr;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
          iVar21 = iVar38;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar39 * 0x10),
                              (interval_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar39 * 0x10),
                            (interval_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + 1;
        }
      }
      goto LAB_00954843;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar21 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
        }
        iVar36 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar38 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        bVar49 = interval_t::operator>
                           ((interval_t *)(lvdata.data + iVar36 * 0x10),
                            (interval_t *)(rvdata.data + iVar38 * 0x10));
        if (bVar49) {
          iVar36 = local_4c0;
          oVar24.ptr = true_sel.ptr;
          iVar38 = iVar21;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar38 = iVar21 + 1;
          iVar36 = iVar21;
          oVar24.ptr = false_sel.ptr;
        }
        (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
        iVar21 = iVar38;
      }
      goto LAB_00954850;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar49 = interval_t::operator>
                           ((interval_t *)(lvdata.data + iVar39 * 0x10),
                            (interval_t *)(rvdata.data + iVar36 * 0x10));
        if (bVar49) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_00954850;
    }
    lVar40 = 0;
    for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
      iVar25 = iVar21;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
      }
      iVar39 = iVar21;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
      }
      iVar36 = iVar21;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
      }
      bVar49 = interval_t::operator>
                         ((interval_t *)(lvdata.data + iVar39 * 0x10),
                          (interval_t *)(rvdata.data + iVar36 * 0x10));
      if (!bVar49) {
        (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
        lVar40 = lVar40 + 1;
      }
    }
    goto LAB_00954779;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_240.ptr = false_sel.ptr;
    local_238.ptr = sel.ptr;
    local_1a0.ptr = true_sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_238.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&true_vec,count);
    OptionalSelection::OptionalSelection(&true_opt,&true_vec);
    SelectionVector::SelectionVector(&false_vec,count);
    OptionalSelection::OptionalSelection(&false_opt,&false_vec);
    SelectionVector::SelectionVector(&maybe_vec,count);
    Vector::Vector(&l_not_null,left);
    Vector::Vector(&r_not_null,right);
    pSVar14 = optional_ptr<const_duckdb::SelectionVector,_true>::operator*(&local_238);
    rchild._0_8_ = null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(&l_not_null,count,&lvdata);
    Vector::ToUnifiedFormat(&r_not_null,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 &&
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      psVar2 = pSVar14->sel_vector;
      local_420 = 0;
      for (iVar21 = 0; uVar20 = count, count != iVar21; iVar21 = iVar21 + 1) {
        sVar32 = (sel_t)iVar21;
        if (psVar2 != (sel_t *)0x0) {
          sVar32 = psVar2[iVar21];
        }
        maybe_vec.sel_vector[iVar21] = sVar32;
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&lchild,count);
      local_420 = 0;
      iVar21 = 0;
      uVar20 = 0;
      for (uVar34 = 0; count != uVar34; uVar34 = uVar34 + 1) {
        uVar41 = uVar34;
        if (pSVar14->sel_vector != (sel_t *)0x0) {
          uVar41 = (ulong)pSVar14->sel_vector[uVar34];
        }
        uVar23 = uVar34;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(lvdata.sel)->sel_vector[uVar34];
        }
        uVar16 = uVar34;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)(rvdata.sel)->sel_vector[uVar34];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0;
        }
        sVar32 = (sel_t)uVar41;
        if ((bool)(bVar49 ^ 1U | bVar50)) {
          if (rchild._0_8_ != 0) {
            this = &optional_ptr<duckdb::ValidityMask,_true>::operator->
                              ((optional_ptr<duckdb::ValidityMask,_true> *)&rchild)->
                    super_TemplatedValidityMask<unsigned_long>;
            TemplatedValidityMask<unsigned_long>::SetInvalid(this,uVar41);
          }
          if (bVar49) {
            if (true_opt.sel != (SelectionVector *)0x0) {
              (true_opt.sel)->sel_vector[local_420] = sVar32;
            }
            local_420 = local_420 + 1;
          }
          else {
            if (false_opt.sel != (SelectionVector *)0x0) {
              (false_opt.sel)->sel_vector[iVar21] = sVar32;
            }
            iVar21 = iVar21 + 1;
          }
        }
        else {
          *(int *)(lchild._0_8_ + uVar20 * 4) = (int)uVar34;
          maybe_vec.sel_vector[uVar20] = sVar32;
          uVar20 = uVar20 + 1;
        }
      }
      OptionalSelection::Advance(&true_opt,local_420);
      OptionalSelection::Advance(&false_opt,iVar21);
      if (uVar20 < count && uVar20 != 0) {
        Vector::Slice(&l_not_null,(SelectionVector *)&lchild,uVar20);
        Vector::Slice(&r_not_null,(SelectionVector *)&lchild,uVar20);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_418.ptr = null_mask.ptr;
      if (uVar20 == 0) goto LAB_0094bce4;
      SelectionVector::SelectionVector(&lcursor,uVar20);
      SelectionVector::SelectionVector(&rcursor,uVar20);
      pVVar17 = ListVector::GetEntry(&l_not_null);
      Vector::Vector((Vector *)&lvdata,pVVar17);
      pVVar17 = ListVector::GetEntry(&r_not_null);
      Vector::Vector((Vector *)&rvdata,pVVar17);
      iVar21 = ListVector::GetListSize(&l_not_null);
      Vector::Flatten((Vector *)&lvdata,iVar21);
      iVar21 = ListVector::GetListSize(&r_not_null);
      Vector::Flatten((Vector *)&rvdata,iVar21);
      Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar20);
      Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar20);
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
      Vector::ToUnifiedFormat(&l_not_null,uVar20,&lvdata_1);
      pdVar6 = lvdata_1.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
      Vector::ToUnifiedFormat(&r_not_null,uVar20,&rvdata_1);
      SelectionVector::SelectionVector(&slice_sel,uVar20);
      for (iVar21 = 0; uVar20 != iVar21; iVar21 = iVar21 + 1) {
        slice_sel.sel_vector[iVar21] = (sel_t)iVar21;
      }
      SelectionVector::SelectionVector(&true_sel_1,uVar20);
      SelectionVector::SelectionVector(&false_sel_1,uVar20);
      true_sel_2.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      true_sel_2.sel_vector = (sel_t *)0x0;
      true_sel_2.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (local_418.ptr == (ValidityMask *)0x0) {
        local_3a8.ptr = (ValidityMask *)0x0;
      }
      else {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_418);
        iVar21 = ValidityMask::Capacity(pVVar15);
        local_3a8.ptr = (ValidityMask *)&true_sel_2;
        TemplatedValidityMask<unsigned_long>::Reset
                  ((TemplatedValidityMask<unsigned_long> *)local_3a8.ptr,iVar21);
      }
      pos_1 = 0;
      local_4c0 = 0;
      while (uVar20 != 0) {
        PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar20);
        PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar20);
        psVar2 = (lvdata_1.sel)->sel_vector;
        psVar4 = (rvdata_1.sel)->sel_vector;
        iVar21 = 0;
        iVar25 = 0;
        uVar34 = 0;
        for (uVar41 = 0; uVar20 != uVar41; uVar41 = uVar41 + 1) {
          uVar23 = uVar41;
          if (slice_sel.sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)slice_sel.sel_vector[uVar41];
          }
          uVar16 = uVar23;
          if (psVar2 != (sel_t *)0x0) {
            uVar16 = (ulong)psVar2[uVar23];
          }
          uVar37 = uVar23;
          if (psVar4 != (sel_t *)0x0) {
            uVar37 = (ulong)psVar4[uVar23];
          }
          if ((*(ulong *)(pdVar6 + uVar16 * 0x10 + 8) == pos_1) ||
             (*(idx_t *)(rvdata_1.data + uVar37 * 0x10 + 8) == pos_1)) {
            if (maybe_vec.sel_vector != (sel_t *)0x0) {
              uVar23 = (ulong)maybe_vec.sel_vector[uVar23];
            }
            if (*(ulong *)(rvdata_1.data + uVar37 * 0x10 + 8) <
                *(ulong *)(pdVar6 + uVar16 * 0x10 + 8)) {
              if (true_opt.sel != (SelectionVector *)0x0) {
                (true_opt.sel)->sel_vector[iVar25] = (sel_t)uVar23;
              }
              iVar25 = iVar25 + 1;
            }
            else {
              if (false_opt.sel != (SelectionVector *)0x0) {
                (false_opt.sel)->sel_vector[iVar21] = (sel_t)uVar23;
              }
              iVar21 = iVar21 + 1;
            }
          }
          else {
            true_sel_1.sel_vector[uVar34] = (sel_t)uVar23;
            uVar34 = uVar34 + 1;
          }
        }
        OptionalSelection::Advance(&true_opt,iVar25);
        OptionalSelection::Advance(&false_opt,iVar21);
        uVar41 = uVar20;
        if (uVar34 < uVar20) {
          DensifyNestedSelection(&true_sel_1,uVar34,&slice_sel);
          PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar34);
          PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar34);
          uVar41 = uVar34;
        }
        iVar21 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                           (&lchild,&rchild,&slice_sel,uVar41,&true_sel_1,&false_sel_1,local_3a8);
        ExtractNestedMask(&slice_sel,uVar41,&maybe_vec,local_3a8.ptr,local_418);
        local_4c0 = local_4c0 + iVar25;
        if (iVar21 != 0) {
          uVar41 = uVar41 - iVar21;
          pSVar14 = &true_sel_1;
          if (uVar41 == 0) {
            pSVar14 = &slice_sel;
          }
          ExtractNestedSelection(pSVar14,iVar21,&maybe_vec,&true_opt);
          local_4c0 = local_4c0 + iVar21;
          DensifyNestedSelection(&false_sel_1,uVar41,&slice_sel);
          PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar41);
          PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar41);
        }
        uVar20 = VectorOperations::NestedEquals
                           (&lchild,&rchild,&slice_sel,uVar41,&true_sel_1,&false_sel_1,local_3a8);
        ExtractNestedMask(&slice_sel,uVar41,&maybe_vec,local_3a8.ptr,local_418);
        pSVar14 = &false_sel_1;
        if (uVar20 == 0) {
          pSVar14 = &slice_sel;
        }
        ExtractNestedSelection(pSVar14,uVar41 - uVar20,&maybe_vec,&false_opt);
        if (uVar41 != uVar20) {
          DensifyNestedSelection(&true_sel_1,uVar20,&slice_sel);
        }
        pos_1 = pos_1 + 1;
      }
LAB_0094f444:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&true_sel_2.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&false_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&true_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&slice_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata_1);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata_1);
      Vector::~Vector(&rchild);
      Vector::~Vector(&lchild);
      Vector::~Vector((Vector *)&rvdata);
      Vector::~Vector((Vector *)&lvdata);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      if (PVar1 == STRUCT) {
        rcursor.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar20 != 0) {
          rchild.vector_type = FLAT_VECTOR;
          rchild._1_7_ = 0;
          rchild.type.id_ = INVALID;
          rchild.type.physical_type_ = ~INVALID;
          rchild.type._2_6_ = 0;
          rchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lvdata_1.sel = (SelectionVector *)0x0;
          lvdata_1.data = (data_ptr_t)0x0;
          lvdata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          this_00 = StructVector::GetEntries(&l_not_null);
          this_01 = StructVector::GetEntries(&r_not_null);
          SelectionVector::SelectionVector((SelectionVector *)&rvdata_1,uVar20);
          for (iVar21 = 0; uVar20 != iVar21; iVar21 = iVar21 + 1) {
            *(int *)((long)&(rvdata_1.sel)->sel_vector + iVar21 * 4) = (int)iVar21;
          }
          SelectionVector::SelectionVector(&true_sel_2,uVar20);
          SelectionVector::SelectionVector(&lcursor,uVar20);
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lchild.vector_type = FLAT_VECTOR;
          lchild._1_7_ = 0;
          lchild.type.id_ = INVALID;
          lchild.type.physical_type_ = ~INVALID;
          lchild.type._2_6_ = 0;
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if (rcursor.sel_vector == (sel_t *)0x0) {
            null_mask_00.ptr = (ValidityMask *)0x0;
          }
          else {
            pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator->
                                ((optional_ptr<duckdb::ValidityMask,_true> *)&rcursor);
            iVar21 = ValidityMask::Capacity(pVVar15);
            null_mask_00.ptr = (ValidityMask *)&lchild;
            TemplatedValidityMask<unsigned_long>::Reset
                      ((TemplatedValidityMask<unsigned_long> *)null_mask_00.ptr,iVar21);
          }
          local_4c0 = 0;
          __n = 0;
          iVar21 = uVar20;
          while( true ) {
            if ((ulong)((long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
            pvVar18 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_00,__n);
            pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar18);
            Vector::Vector((Vector *)&lvdata,pVVar19);
            Vector::Flatten((Vector *)&lvdata,uVar20);
            Vector::Slice((Vector *)&lvdata,(SelectionVector *)&rvdata_1,iVar21);
            pvVar18 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_01,__n);
            pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar18);
            Vector::Vector((Vector *)&rvdata,pVVar19);
            Vector::Flatten((Vector *)&rvdata,uVar20);
            Vector::Slice((Vector *)&rvdata,(SelectionVector *)&rvdata_1,iVar21);
            iVar25 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                iVar21,&true_sel_2,&lcursor,null_mask_00);
            ExtractNestedMask((SelectionVector *)&rvdata_1,iVar21,&maybe_vec,null_mask_00.ptr,
                              (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
            if (iVar25 != 0) {
              iVar21 = iVar21 - iVar25;
              pUVar33 = (UnifiedVectorFormat *)&true_sel_2;
              if (iVar21 == 0) {
                pUVar33 = &rvdata_1;
              }
              ExtractNestedSelection((SelectionVector *)pUVar33,iVar25,&maybe_vec,&true_opt);
              DensifyNestedSelection(&lcursor,iVar21,(SelectionVector *)&rvdata_1);
              local_4c0 = local_4c0 + iVar25;
            }
            if (__n == ((long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
              iVar25 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                 ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                  iVar21,&true_sel_2,&lcursor,null_mask_00);
              ExtractNestedMask((SelectionVector *)&rvdata_1,iVar21,&maybe_vec,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar35.ptr = &true_sel_2;
              if (iVar21 == iVar25) {
                oVar35.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar35.ptr,iVar25,&maybe_vec,&true_opt);
              oVar35.ptr = &lcursor;
              if (iVar25 == 0) {
                oVar35.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar35.ptr,iVar21 - iVar25,&maybe_vec,&false_opt);
              local_4c0 = local_4c0 + iVar25;
            }
            else {
              iVar25 = VectorOperations::NestedEquals
                                 ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                  iVar21,&true_sel_2,&lcursor,null_mask_00);
              ExtractNestedMask((SelectionVector *)&rvdata_1,iVar21,&maybe_vec,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar35.ptr = &lcursor;
              if (iVar25 == 0) {
                oVar35.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar35.ptr,iVar21 - iVar25,&maybe_vec,&false_opt);
              if (iVar21 != iVar25) {
                DensifyNestedSelection(&true_sel_2,iVar25,(SelectionVector *)&rvdata_1);
                iVar21 = iVar25;
              }
            }
            Vector::~Vector((Vector *)&rvdata);
            Vector::~Vector((Vector *)&lvdata);
            __n = __n + 1;
          }
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&lcursor.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&true_sel_2.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rvdata_1.validity);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&lvdata_1);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&rchild);
          goto LAB_0094f4e5;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&lvdata,"Unimplemented type for DISTINCT",(allocator *)&rvdata);
          NotImplementedException::NotImplementedException(this_03,(string *)&lvdata);
          __cxa_throw(this_03,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_418.ptr = null_mask.ptr;
        if (uVar20 != 0) {
          iVar21 = ArrayType::GetSize(&l_not_null.type);
          SelectionVector::SelectionVector(&lcursor,uVar20);
          SelectionVector::SelectionVector(&rcursor,uVar20);
          pVVar17 = ArrayVector::GetEntry(&l_not_null);
          Vector::Vector((Vector *)&lvdata,pVVar17);
          pVVar17 = ArrayVector::GetEntry(&r_not_null);
          Vector::Vector((Vector *)&rvdata,pVVar17);
          iVar25 = ArrayVector::GetTotalSize(&l_not_null);
          Vector::Flatten((Vector *)&lvdata,iVar25);
          iVar25 = ArrayVector::GetTotalSize(&r_not_null);
          Vector::Flatten((Vector *)&rvdata,iVar25);
          Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar20);
          Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar20);
          UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
          Vector::ToUnifiedFormat(&l_not_null,uVar20,&lvdata_1);
          UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
          Vector::ToUnifiedFormat(&r_not_null,uVar20,&rvdata_1);
          SelectionVector::SelectionVector(&slice_sel,uVar20);
          for (iVar25 = 0; uVar20 != iVar25; iVar25 = iVar25 + 1) {
            slice_sel.sel_vector[iVar25] = (sel_t)iVar25;
          }
          SelectionVector::SelectionVector(&true_sel_1,uVar20);
          SelectionVector::SelectionVector(&false_sel_1,uVar20);
          true_sel_2.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          true_sel_2.sel_vector = (sel_t *)0x0;
          true_sel_2.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if (local_418.ptr == (ValidityMask *)0x0) {
            pos_1 = 0;
          }
          else {
            pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_418);
            iVar25 = ValidityMask::Capacity(pVVar15);
            pos_1 = (idx_t)&true_sel_2;
            TemplatedValidityMask<unsigned_long>::Reset
                      ((TemplatedValidityMask<unsigned_long> *)pos_1,iVar25);
          }
          local_4c0 = 0;
          iVar25 = 0;
          while (uVar20 != 0) {
            PositionArrayCursor(&lcursor,&lvdata_1,iVar25,&slice_sel,uVar20,iVar21);
            PositionArrayCursor(&rcursor,&rvdata_1,iVar25,&slice_sel,uVar20,iVar21);
            iVar39 = 0;
            uVar41 = 0;
            for (uVar34 = 0; uVar20 != uVar34; uVar34 = uVar34 + 1) {
              uVar23 = uVar34;
              if (slice_sel.sel_vector != (sel_t *)0x0) {
                uVar23 = (ulong)slice_sel.sel_vector[uVar34];
              }
              if (iVar21 == iVar25) {
                if (maybe_vec.sel_vector != (sel_t *)0x0) {
                  uVar23 = (ulong)maybe_vec.sel_vector[uVar23];
                }
                if (false_opt.sel != (SelectionVector *)0x0) {
                  (false_opt.sel)->sel_vector[iVar39] = (sel_t)uVar23;
                }
                iVar39 = iVar39 + 1;
              }
              else {
                true_sel_1.sel_vector[uVar41] = (sel_t)uVar23;
                uVar41 = uVar41 + 1;
              }
            }
            OptionalSelection::Advance(&true_opt,0);
            OptionalSelection::Advance(&false_opt,iVar39);
            uVar34 = uVar20;
            if (uVar41 < uVar20) {
              DensifyNestedSelection(&true_sel_1,uVar41,&slice_sel);
              PositionArrayCursor(&lcursor,&lvdata_1,iVar25,&slice_sel,uVar41,iVar21);
              PositionArrayCursor(&rcursor,&rvdata_1,iVar25,&slice_sel,uVar41,iVar21);
              uVar34 = uVar41;
            }
            iVar39 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               (&lchild,&rchild,&slice_sel,uVar34,&true_sel_1,&false_sel_1,
                                (optional_ptr<duckdb::ValidityMask,_true>)pos_1);
            ExtractNestedMask(&slice_sel,uVar34,&maybe_vec,(ValidityMask *)pos_1,local_418);
            if (iVar39 != 0) {
              uVar34 = uVar34 - iVar39;
              oVar35.ptr = &true_sel_1;
              if (uVar34 == 0) {
                oVar35.ptr = &slice_sel;
              }
              ExtractNestedSelection(oVar35.ptr,iVar39,&maybe_vec,&true_opt);
              local_4c0 = local_4c0 + iVar39;
              DensifyNestedSelection(&false_sel_1,uVar34,&slice_sel);
              PositionArrayCursor(&lcursor,&lvdata_1,iVar25,&slice_sel,uVar34,iVar21);
              PositionArrayCursor(&rcursor,&rvdata_1,iVar25,&slice_sel,uVar34,iVar21);
            }
            uVar20 = VectorOperations::NestedEquals
                               (&lchild,&rchild,&slice_sel,uVar34,&true_sel_1,&false_sel_1,local_418
                               );
            ExtractNestedMask(&slice_sel,uVar34,&maybe_vec,(ValidityMask *)pos_1,local_418);
            oVar35.ptr = &false_sel_1;
            if (uVar20 == 0) {
              oVar35.ptr = &slice_sel;
            }
            ExtractNestedSelection(oVar35.ptr,uVar34 - uVar20,&maybe_vec,&false_opt);
            if (uVar34 != uVar20) {
              DensifyNestedSelection(&true_sel_1,uVar20,&slice_sel);
            }
            iVar25 = iVar25 + 1;
          }
          goto LAB_0094f444;
        }
      }
LAB_0094bce4:
      local_4c0 = 0;
    }
LAB_0094f4e5:
    local_4c0 = local_4c0 + local_420;
    if (true_sel.ptr != (SelectionVector *)0x0) {
      pSVar14 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_1a0);
      DensifyNestedSelection(&true_vec,local_4c0,pSVar14);
    }
    if (local_240.ptr != (SelectionVector *)0x0) {
      pSVar14 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_240);
      DensifyNestedSelection(&false_vec,count - local_4c0,pSVar14);
    }
    Vector::~Vector(&r_not_null);
    Vector::~Vector(&l_not_null);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&maybe_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&true_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pUVar33 = (UnifiedVectorFormat *)&true_vec;
LAB_00956411:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pUVar33->validity);
    return local_4c0;
  default:
    if (PVar1 == VARCHAR) {
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar15);
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar15);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar46 = (string_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar42 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar40 = 0;
            local_4c0 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              psVar46 = psVar46 + 1;
              psVar29 = psVar29 + 1;
            }
            return local_4c0;
          }
          iVar21 = 0;
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              psVar46 = psVar46 + 1;
              psVar29 = psVar29 + 1;
            }
            return local_4c0;
          }
          lVar40 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                               (psVar29,psVar46,!bVar50,!bVar49);
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            psVar46 = psVar46 + 1;
            psVar29 = psVar29 + 1;
          }
          goto LAB_0095584f;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar46 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          iVar21 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar40 = 0;
              for (; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar50 = false;
                }
                else {
                  bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                   (psVar29,psVar46,bVar50,!bVar49);
                (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
                lVar40 = lVar40 + (ulong)!bVar49;
                psVar29 = psVar29 + 1;
              }
              goto LAB_009563ff;
            }
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              psVar29 = psVar29 + 1;
            }
          }
          else {
            lVar40 = 0;
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              psVar29 = psVar29 + 1;
            }
          }
          goto LAB_0095640c;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar46 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar15 = &right->validity;
          iVar21 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar40 = 0;
              for (; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar49 = false;
                }
                else {
                  bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
                bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                   (psVar29,psVar46,!bVar50,bVar49);
                (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
                lVar40 = lVar40 + (ulong)!bVar49;
                psVar46 = psVar46 + 1;
              }
              goto LAB_009563ff;
            }
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar50,bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              psVar46 = psVar46 + 1;
            }
          }
          else {
            lVar40 = 0;
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar50,bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              psVar46 = psVar46 + 1;
            }
          }
          goto LAB_0095640c;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*puVar3 & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                             ((string_t *)left->data,(string_t *)right->data,bVar50,bVar49);
          if (!bVar49) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar21 = 0;
          for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
            iVar39 = iVar25;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
            }
            iVar36 = iVar25;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
            }
            iVar38 = iVar25;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar36 * 0x10),
                                (string_t *)(rvdata.data + iVar38 * 0x10),bVar50,bVar49);
            if (bVar49) {
              iVar36 = local_4c0;
              oVar24.ptr = true_sel.ptr;
              iVar38 = iVar21;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar38 = iVar21 + 1;
              iVar36 = iVar21;
              oVar24.ptr = false_sel.ptr;
            }
            (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
            iVar21 = iVar38;
          }
          goto LAB_00954850;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            iVar39 = iVar21;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
            }
            iVar36 = iVar21;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar39 * 0x10),
                                (string_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
            if (bVar49) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_00954850;
        }
        lVar40 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar39 * 0x10),
                              (string_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
          if (!bVar49) {
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        goto LAB_00954843;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar21 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar49 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(lvdata.data + iVar36 * 0x10),
                              (string_t *)(rvdata.data + iVar38 * 0x10));
          if (bVar49) {
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            iVar38 = iVar21;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar38 = iVar21 + 1;
            iVar36 = iVar21;
            oVar24.ptr = false_sel.ptr;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
          iVar21 = iVar38;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar49 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(lvdata.data + iVar39 * 0x10),
                              (string_t *)(rvdata.data + iVar36 * 0x10));
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar49 = string_t::StringComparisonOperators::GreaterThan
                           ((string_t *)(lvdata.data + iVar39 * 0x10),
                            (string_t *)(rvdata.data + iVar36 * 0x10));
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + 1;
        }
      }
    }
    else if (PVar1 == UINT128) {
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar15);
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar15);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar47 = (uhugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar42 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar40 = 0;
            local_4c0 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              puVar47 = puVar47 + 1;
              puVar30 = puVar30 + 1;
            }
            return local_4c0;
          }
          iVar21 = 0;
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              puVar47 = puVar47 + 1;
              puVar30 = puVar30 + 1;
            }
            return local_4c0;
          }
          lVar40 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                               (puVar30,puVar47,!bVar50,!bVar49);
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            puVar47 = puVar47 + 1;
            puVar30 = puVar30 + 1;
          }
          goto LAB_0095584f;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar47 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          iVar21 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar40 = 0;
              for (; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar50 = false;
                }
                else {
                  bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                   (puVar30,puVar47,bVar50,!bVar49);
                (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
                lVar40 = lVar40 + (ulong)!bVar49;
                puVar30 = puVar30 + 1;
              }
              goto LAB_009563ff;
            }
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              puVar30 = puVar30 + 1;
            }
          }
          else {
            lVar40 = 0;
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              puVar30 = puVar30 + 1;
            }
          }
          goto LAB_0095640c;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar47 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar15 = &right->validity;
          iVar21 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar40 = 0;
              for (; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar49 = false;
                }
                else {
                  bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
                bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                   (puVar30,puVar47,!bVar50,bVar49);
                (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
                lVar40 = lVar40 + (ulong)!bVar49;
                puVar47 = puVar47 + 1;
              }
              goto LAB_009563ff;
            }
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar50,bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              puVar47 = puVar47 + 1;
            }
          }
          else {
            lVar40 = 0;
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar50,bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              puVar47 = puVar47 + 1;
            }
          }
          goto LAB_0095640c;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*puVar3 & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)left->data,(uhugeint_t *)right->data,bVar50,bVar49);
          if (!bVar49) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar21 = 0;
          for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
            iVar39 = iVar25;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
            }
            iVar36 = iVar25;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
            }
            iVar38 = iVar25;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar36 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar38 * 0x10),bVar50,bVar49);
            if (bVar49) {
              iVar36 = local_4c0;
              oVar24.ptr = true_sel.ptr;
              iVar38 = iVar21;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar38 = iVar21 + 1;
              iVar36 = iVar21;
              oVar24.ptr = false_sel.ptr;
            }
            (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
            iVar21 = iVar38;
          }
          goto LAB_00954850;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            iVar39 = iVar21;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
            }
            iVar36 = iVar21;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
            if (bVar49) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_00954850;
        }
        lVar40 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
          if (!bVar49) {
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        goto LAB_00954843;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar21 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar49 = uhugeint_t::operator>
                             ((uhugeint_t *)(lvdata.data + iVar36 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar38 * 0x10));
          if (bVar49) {
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            iVar38 = iVar21;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar38 = iVar21 + 1;
            iVar36 = iVar21;
            oVar24.ptr = false_sel.ptr;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
          iVar21 = iVar38;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar49 = uhugeint_t::operator>
                             ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar36 * 0x10));
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar49 = uhugeint_t::operator>
                           ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                            (uhugeint_t *)(rvdata.data + iVar36 * 0x10));
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + 1;
        }
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_0094acf5_caseD_a;
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar15);
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar15);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar48 = (hugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar42 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar40 = 0;
            local_4c0 = 0;
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              phVar48 = phVar48 + 1;
              phVar31 = phVar31 + 1;
            }
            return local_4c0;
          }
          iVar21 = 0;
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              phVar48 = phVar48 + 1;
              phVar31 = phVar31 + 1;
            }
            return local_4c0;
          }
          lVar40 = 0;
          for (; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar42->super_TemplatedValidityMask<unsigned_long>,iVar21);
            bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                               (phVar31,phVar48,!bVar50,!bVar49);
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + (ulong)!bVar49;
            phVar48 = phVar48 + 1;
            phVar31 = phVar31 + 1;
          }
          goto LAB_0095584f;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar48 = (hugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          iVar21 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar40 = 0;
              for (; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar50 = false;
                }
                else {
                  bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                   (phVar31,phVar48,bVar50,!bVar49);
                (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
                lVar40 = lVar40 + (ulong)!bVar49;
                phVar31 = phVar31 + 1;
              }
              goto LAB_009563ff;
            }
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              phVar31 = phVar31 + 1;
            }
          }
          else {
            lVar40 = 0;
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,bVar50,!bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              phVar31 = phVar31 + 1;
            }
          }
          goto LAB_0095640c;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar48 = (hugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar15 = &right->validity;
          iVar21 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar40 = 0;
              for (; count != iVar21; iVar21 = iVar21 + 1) {
                iVar25 = iVar21;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar49 = false;
                }
                else {
                  bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
                bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                   (phVar31,phVar48,!bVar50,bVar49);
                (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
                lVar40 = lVar40 + (ulong)!bVar49;
                phVar48 = phVar48 + 1;
              }
              goto LAB_009563ff;
            }
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar50,bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              phVar48 = phVar48 + 1;
            }
          }
          else {
            lVar40 = 0;
            local_4c0 = 0;
            for (; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar21);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar50,bVar49);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
              lVar40 = lVar40 + (ulong)!bVar49;
              phVar48 = phVar48 + 1;
            }
          }
          goto LAB_0095640c;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*puVar3 & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)left->data,(hugeint_t *)right->data,bVar50,bVar49);
          if (!bVar49) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              (false_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
              iVar25 = iVar21;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
              }
              (true_sel.ptr)->sel_vector[iVar21] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar21 = 0;
          for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
            iVar39 = iVar25;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
            }
            iVar36 = iVar25;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
            }
            iVar38 = iVar25;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                               ((hugeint_t *)(lvdata.data + iVar36 * 0x10),
                                (hugeint_t *)(rvdata.data + iVar38 * 0x10),bVar50,bVar49);
            if (bVar49) {
              iVar36 = local_4c0;
              oVar24.ptr = true_sel.ptr;
              iVar38 = iVar21;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar38 = iVar21 + 1;
              iVar36 = iVar21;
              oVar24.ptr = false_sel.ptr;
            }
            (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
            iVar21 = iVar38;
          }
          goto LAB_00954850;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
            iVar25 = iVar21;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
            }
            iVar39 = iVar21;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
            }
            iVar36 = iVar21;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                               ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                                (hugeint_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
            if (bVar49) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_00954850;
        }
        lVar40 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar36 * 0x10),bVar50,bVar49);
          if (!bVar49) {
            (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
            lVar40 = lVar40 + 1;
          }
        }
        goto LAB_00954843;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar21 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(sel.ptr)->sel_vector[iVar25];
          }
          iVar36 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar38 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar49 = GreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar36 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar38 * 0x10));
          if (bVar49) {
            iVar36 = local_4c0;
            oVar24.ptr = true_sel.ptr;
            iVar38 = iVar21;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar38 = iVar21 + 1;
            iVar36 = iVar21;
            oVar24.ptr = false_sel.ptr;
          }
          (oVar24.ptr)->sel_vector[iVar36] = (sel_t)iVar39;
          iVar21 = iVar38;
        }
        goto LAB_00954850;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
          iVar25 = iVar21;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
          }
          iVar39 = iVar21;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
          }
          iVar36 = iVar21;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
          }
          bVar49 = GreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar36 * 0x10));
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_00954850;
      }
      lVar40 = 0;
      for (iVar21 = 0; count != iVar21; iVar21 = iVar21 + 1) {
        iVar25 = iVar21;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar25 = (idx_t)(sel.ptr)->sel_vector[iVar21];
        }
        iVar39 = iVar21;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar21];
        }
        iVar36 = iVar21;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(rvdata.sel)->sel_vector[iVar21];
        }
        bVar49 = GreaterThan::Operation<duckdb::hugeint_t>
                           ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                            (hugeint_t *)(rvdata.data + iVar36 * 0x10));
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar40] = (sel_t)iVar25;
          lVar40 = lVar40 + 1;
        }
      }
    }
LAB_00954779:
    local_4c0 = count - lVar40;
    goto LAB_00954850;
  }
  local_4c0 = count - lVar40;
LAB_00954850:
  UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
  return local_4c0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}